

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O1

void __thiscall icu_63::RBBINode::flattenSets(RBBINode *this)

{
  RBBINode *pRVar1;
  RBBINode *pRVar2;
  RBBINode *setRefNode;
  RBBINode *pRVar3;
  void *in_RSI;
  
  while( true ) {
    pRVar3 = this;
    pRVar2 = pRVar3->fLeftChild;
    if (pRVar2 != (RBBINode *)0x0) {
      if (pRVar2->fType == setRef) {
        pRVar1 = cloneTree(pRVar2->fLeftChild->fLeftChild);
        pRVar3->fLeftChild = pRVar1;
        pRVar1->fParent = pRVar3;
        ~RBBINode(pRVar2);
        UMemory::operator_delete((UMemory *)pRVar2,in_RSI);
      }
      else {
        flattenSets(pRVar2);
      }
    }
    this = pRVar3->fRightChild;
    if (this == (RBBINode *)0x0) break;
    if (this->fType == setRef) {
      pRVar2 = cloneTree(this->fLeftChild->fLeftChild);
      pRVar3->fRightChild = pRVar2;
      pRVar2->fParent = pRVar3;
      ~RBBINode(this);
      UMemory::operator_delete((UMemory *)this,in_RSI);
      return;
    }
  }
  return;
}

Assistant:

void RBBINode::flattenSets() {
    U_ASSERT(fType != setRef);

    if (fLeftChild != NULL) {
        if (fLeftChild->fType==setRef) {
            RBBINode *setRefNode = fLeftChild;
            RBBINode *usetNode   = setRefNode->fLeftChild;
            RBBINode *replTree   = usetNode->fLeftChild;
            fLeftChild           = replTree->cloneTree();
            fLeftChild->fParent  = this;
            delete setRefNode;
        } else {
            fLeftChild->flattenSets();
        }
    }

    if (fRightChild != NULL) {
        if (fRightChild->fType==setRef) {
            RBBINode *setRefNode = fRightChild;
            RBBINode *usetNode   = setRefNode->fLeftChild;
            RBBINode *replTree   = usetNode->fLeftChild;
            fRightChild           = replTree->cloneTree();
            fRightChild->fParent  = this;
            delete setRefNode;
        } else {
            fRightChild->flattenSets();
        }
    }
}